

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

string * mxx::get_processor_name_abi_cxx11_(void)

{
  string *in_RDI;
  int p_len;
  char p_name [257];
  int local_12c;
  char local_128 [272];
  
  MPI_Get_processor_name(local_128,&local_12c);
  local_128[local_12c] = '\0';
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string get_processor_name() {
    char p_name[MPI_MAX_PROCESSOR_NAME+1];
    int p_len;
    MPI_Get_processor_name(p_name, &p_len);
    p_name[p_len] = '\0'; // make string NULL-terminated (if not yet so)
    std::string str(p_name);
    return str;
}